

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_decompressBegin_usingDict(ZSTD_DCtx *dctx,void *dict,size_t dictSize)

{
  size_t sVar1;
  void *pvVar2;
  
  ZSTD_decompressBegin(dctx);
  if (dictSize != 0 && dict != (void *)0x0) {
    pvVar2 = dict;
    if ((7 < dictSize) && (*dict == -0x13cf5bc9)) {
      dctx->dictID = *(U32 *)((long)dict + 4);
      sVar1 = ZSTD_loadDEntropy(&dctx->entropy,dict,dictSize);
      if (0xffffffffffffff88 < sVar1) {
        return 0xffffffffffffffe2;
      }
      pvVar2 = (void *)(sVar1 + (long)dict);
      dctx->litEntropy = 1;
      dctx->fseEntropy = 1;
    }
    dctx->dictEnd = dctx->previousDstEnd;
    dctx->virtualStart =
         (void *)(((long)dctx->prefixStart - (long)dctx->previousDstEnd) + (long)pvVar2);
    dctx->prefixStart = pvVar2;
    dctx->previousDstEnd = (void *)((long)dict + dictSize);
  }
  return 0;
}

Assistant:

size_t ZSTD_decompressBegin_usingDict(ZSTD_DCtx* dctx, const void* dict, size_t dictSize)
{
    FORWARD_IF_ERROR( ZSTD_decompressBegin(dctx) , "");
    if (dict && dictSize)
        RETURN_ERROR_IF(
            ZSTD_isError(ZSTD_decompress_insertDictionary(dctx, dict, dictSize)),
            dictionary_corrupted, "");
    return 0;
}